

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parseSignals(Moc *this,ClassDef *def)

{
  qsizetype *pqVar1;
  Token TVar2;
  long lVar3;
  uint uVar4;
  QTypeRevision QVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  char *msg;
  long in_FS_OFFSET;
  FunctionDef funcDef;
  FunctionDef local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->super_Parser).index;
  bVar8 = 0xff;
  if (lVar3 < (this->super_Parser).symbols.d.size) {
    uVar6 = 0xff;
    if ((this->super_Parser).symbols.d.ptr[lVar3].token == Q_REVISION_TOKEN) {
      (this->super_Parser).index = lVar3 + 1;
      QVar5 = parseRevision(this);
      uVar6 = (uint)(ushort)QVar5;
      bVar8 = QVar5.m_majorVersion;
    }
  }
  else {
    uVar6 = 0xff;
  }
  lVar3 = (this->super_Parser).index;
  if (((this->super_Parser).symbols.d.size <= lVar3) ||
     ((this->super_Parser).symbols.d.ptr[lVar3].token != COLON)) {
    Parser::error(&this->super_Parser,(char *)0x0);
  }
  lVar7 = lVar3 + 1;
  (this->super_Parser).index = lVar7;
  if ((def->super_BaseDef).begin <= lVar3) {
    do {
      if (((def->super_BaseDef).end + -1 <= lVar7) || ((this->super_Parser).symbols.d.size <= lVar7)
         ) break;
      (this->super_Parser).index = lVar7 + 1;
      TVar2 = (this->super_Parser).symbols.d.ptr[lVar7].token;
      if ((int)TVar2 < 0x22) {
        if (TVar2 != SEMIC) goto LAB_0011c01d;
      }
      else {
        if ((int)TVar2 < 0x29) {
          if (TVar2 == FRIEND) {
            until(this,SEMIC);
            goto LAB_0011c148;
          }
        }
        else {
          if ((TVar2 - PRIVATE < 3) || (TVar2 - Q_SIGNALS_TOKEN < 2)) {
            pqVar1 = &(this->super_Parser).index;
            *pqVar1 = *pqVar1 + -1;
            break;
          }
          if (TVar2 == USING) {
            msg = "\'using\' directive not supported in \'signals\' section";
            goto LAB_0011c19b;
          }
        }
LAB_0011c01d:
        pqVar1 = &(this->super_Parser).index;
        *pqVar1 = *pqVar1 + -1;
        memset(&local_108,0xaa,0xd0);
        local_108.type.name.d.d = (Data *)0x0;
        local_108.type.name.d.ptr = (char *)0x0;
        local_108.type.name.d.size = 0;
        local_108.type.rawName.d.d = (Data *)0x0;
        local_108.type.rawName.d.ptr = (char *)0x0;
        local_108.type.rawName.d.size = 0;
        local_108.type._48_1_ = local_108.type._48_1_ & 0xfc;
        memset(&local_108.type.typeTag,0,0x9c);
        local_108.access = Public;
        parseFunction(this,&local_108,false);
        if (local_108.isVirtual == true) {
          Parser::warning(&this->super_Parser,"Signals cannot be declared virtual");
        }
        if (local_108.inlineCode == true) {
          msg = "Not a signal declaration";
LAB_0011c19b:
          Parser::error(&this->super_Parser,msg);
        }
        uVar4 = local_108.revision;
        if ((0 < local_108.revision) ||
           (uVar4 = uVar6 & 0xff | (uint)bVar8 << 8, (bVar8 & (byte)uVar6) != 0xff)) {
          local_108.revision = uVar4;
          def->revisionedMethods = def->revisionedMethods + 1;
        }
        while( true ) {
          QtPrivate::QMovableArrayOps<FunctionDef>::emplace<FunctionDef_const&>
                    ((QMovableArrayOps<FunctionDef> *)&def->signalList,(def->signalList).d.size,
                     &local_108);
          QList<FunctionDef>::end(&def->signalList);
          if ((local_108.arguments.d.size == 0) ||
             (local_108.arguments.d.ptr[local_108.arguments.d.size + -1].isDefault != true)) break;
          local_108.wasCloned = true;
          if ((local_108.arguments.d.d == (Data *)0x0) ||
             (1 < ((local_108.arguments.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i)) {
            QArrayDataPointer<ArgumentDef>::reallocateAndGrow
                      (&local_108.arguments.d,GrowsAtEnd,0,(QArrayDataPointer<ArgumentDef> *)0x0);
          }
          ArgumentDef::~ArgumentDef(local_108.arguments.d.ptr + local_108.arguments.d.size + -1);
          local_108.arguments.d.size = local_108.arguments.d.size + -1;
        }
        FunctionDef::~FunctionDef(&local_108);
      }
LAB_0011c148:
      lVar7 = (this->super_Parser).index;
    } while ((def->super_BaseDef).begin < lVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parseSignals(ClassDef *def)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'signals' section");
        default:
            prev();
        }
        FunctionDef funcDef;
        funcDef.access = FunctionDef::Public;
        parseFunction(&funcDef);
        if (funcDef.isVirtual)
            warning("Signals cannot be declared virtual");
        if (funcDef.inlineCode)
            error("Not a signal declaration");
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->signalList += funcDef;
        handleDefaultArguments(&def->signalList, funcDef);
    }
}